

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_lh_zo.c
# Opt level: O0

void glmc_look_anyup_lh_zo(float *eye,float *dir,vec4 *dest)

{
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 up;
  vec3 target;
  vec3 s;
  vec3 u;
  vec3 f_1;
  float norm;
  float norm_1;
  vec3 c;
  vec3 c_1;
  vec3 result;
  float f;
  float ignore;
  float local_258 [4];
  float *local_248;
  float *local_240;
  float *local_238;
  float local_230;
  float local_22c;
  float local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float local_194;
  float *local_190;
  float *local_188;
  float *local_180;
  float *local_178;
  float *local_168;
  float local_15c;
  float local_158;
  float local_154;
  float *local_150;
  float *local_148;
  float *local_140;
  float local_130;
  float local_12c;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float local_c4;
  float *local_c0;
  float *local_b8;
  float local_ac;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float *local_20;
  float *local_18;
  float *local_10;
  float *local_8;
  
  local_20 = local_258;
  local_248 = in_RDX;
  local_240 = in_RSI;
  local_238 = in_RDI;
  local_18 = in_RSI;
  local_28 = modff(ABS(*in_RSI) + 0.5,&local_24);
  local_34 = -local_18[1];
  local_30 = -local_28 * local_18[2] + *local_18;
  local_2c = local_28 * local_18[1];
  local_8 = &local_34;
  local_10 = local_20;
  *local_20 = local_34;
  local_10[1] = local_8[1];
  local_10[2] = local_8[2];
  local_208 = local_238;
  local_210 = local_240;
  local_218 = local_258;
  local_220 = local_248;
  local_40 = local_238;
  local_48 = local_240;
  local_50 = &local_230;
  local_230 = *local_238 + *local_240;
  local_22c = local_238[1] + local_240[1];
  local_228 = local_238[2] + local_240[2];
  local_1b8 = local_238;
  local_1c0 = &local_230;
  local_1d0 = local_248;
  local_1a8 = local_238;
  local_1b0 = &local_1e0;
  local_1e0 = local_230 - *local_238;
  local_1dc = local_22c - local_238[1];
  local_1d8 = local_228 - local_238[2];
  local_190 = &local_1e0;
  local_1c8 = local_218;
  local_1a0 = local_1c0;
  local_d8 = local_190;
  local_a0 = local_190;
  local_98 = local_190;
  local_90 = local_190;
  local_194 = sqrtf(local_1d8 * local_1d8 + local_1e0 * local_1e0 + local_1dc * local_1dc);
  if (local_194 < 1.1920929e-07) {
    local_190[2] = 0.0;
    local_190[1] = 0.0;
    *local_190 = 0.0;
  }
  else {
    local_ac = 1.0 / local_194;
    local_a8 = local_190;
    local_b8 = local_190;
    *local_190 = *local_190 * local_ac;
    local_b8[1] = local_a8[1] * local_ac;
    local_b8[2] = local_a8[2] * local_ac;
  }
  local_178 = local_1c8;
  local_180 = &local_1e0;
  local_188 = &local_200;
  local_140 = local_1c8;
  local_15c = local_1c8[1] * local_1d8 + -(local_1c8[2] * local_1dc);
  local_58 = &local_15c;
  local_1fc = local_158;
  local_1f8 = local_154;
  fVar1 = local_158 * local_158;
  fVar3 = local_200 * local_200;
  fVar2 = local_154 * local_154;
  local_200 = local_15c;
  local_168 = local_188;
  local_158 = local_1c8[2] * local_1e0 + -(*local_1c8 * local_1d8);
  local_154 = *local_1c8 * local_1dc + -(local_1c8[1] * local_1e0);
  local_150 = local_188;
  local_148 = local_180;
  local_e0 = local_188;
  local_88 = local_188;
  local_80 = local_188;
  local_78 = local_188;
  local_60 = local_188;
  local_c4 = sqrtf(fVar2 + fVar3 + fVar1);
  if (local_c4 < 1.1920929e-07) {
    local_168[2] = 0.0;
    local_168[1] = 0.0;
    *local_168 = 0.0;
  }
  else {
    local_c4 = 1.0 / local_c4;
    local_c0 = local_168;
    local_d0 = local_168;
    *local_168 = *local_168 * local_c4;
    local_d0[1] = local_c0[1] * local_c4;
    local_d0[2] = local_c0[2] * local_c4;
  }
  fVar1 = local_1dc * local_1f8 + -(local_1d8 * local_1fc);
  *local_1d0 = local_200;
  local_1d0[1] = fVar1;
  local_1d0[2] = local_1e0;
  local_1d0[4] = local_1fc;
  local_1d0[5] = local_130;
  local_1d0[6] = local_1dc;
  local_1d0[8] = local_1f8;
  local_1d0[9] = local_12c;
  local_1d0[10] = local_1d8;
  local_1d0[0xc] = -(local_1f8 * local_1b8[2] + local_200 * *local_1b8 + local_1fc * local_1b8[1]);
  local_1d0[0xd] = -(local_12c * local_1b8[2] + fVar1 * *local_1b8 + local_130 * local_1b8[1]);
  local_1d0[0xe] = -(local_1d8 * local_1b8[2] + local_1e0 * *local_1b8 + local_1dc * local_1b8[1]);
  local_1d0[0xb] = 0.0;
  local_1d0[7] = 0.0;
  local_1d0[3] = 0.0;
  local_1d0[0xf] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_look_anyup_lh_zo(vec3 eye, vec3 dir, mat4 dest) {
  glm_look_anyup_lh_zo(eye, dir, dest);
}